

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

Json __thiscall slack::_detail::Slacking::post(Slacking *this,string *method,Json *json)

{
  Json *in_RCX;
  json_value extraout_RDX;
  Json JVar1;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> elements;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> vStack_78;
  string local_60;
  string local_40;
  
  json_to_elements(&vStack_78,in_RCX);
  std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
  emplace_back<char_const(&)[6],std::__cxx11::string&>
            ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)&vStack_78,
             (char (*) [6])0x12b354,method + 6);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"&","");
  join<slack::_detail::Element>(&local_40,&vStack_78,&local_60);
  post(this,method,(string *)json);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::~vector
            (&vStack_78);
  JVar1.m_value.object = extraout_RDX.object;
  JVar1._0_8_ = this;
  return JVar1;
}

Assistant:

Json post(const std::string& method, const Json& json) {
        
        auto elements = json_to_elements(json);
        elements.emplace_back("token", token_);
        return post(method, join(elements));
    }